

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

Severity jbcoin::Logs::toSeverity(LogSeverity level)

{
  Severity local_c;
  LogSeverity level_local;
  
  switch(level) {
  case lsTRACE:
    local_c = kAll;
    break;
  case lsDEBUG:
    local_c = kDebug;
    break;
  case lsINFO:
    local_c = kInfo;
    break;
  case lsWARNING:
    local_c = kWarning;
    break;
  case lsERROR:
    local_c = kError;
    break;
  case lsFATAL:
    local_c = kFatal;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/basics/impl/Log.cpp"
                  ,0xf3,"static beast::severities::Severity jbcoin::Logs::toSeverity(LogSeverity)");
  }
  return local_c;
}

Assistant:

beast::severities::Severity
Logs::toSeverity (LogSeverity level)
{
    using namespace beast::severities;
    switch (level)
    {
    case lsTRACE:   return kTrace;
    case lsDEBUG:   return kDebug;
    case lsINFO:    return kInfo;
    case lsWARNING: return kWarning;
    case lsERROR:   return kError;
    default:
        assert(false);
    case lsFATAL:
        break;
    }

    return kFatal;
}